

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span-main.t.hpp
# Opt level: O2

ostream * nonstd::span_lite::operator<<(ostream *os,span<unsigned_char,_18446744073709551615UL> *v)

{
  ostream *poVar1;
  lest *this;
  uchar *chr;
  allocator<char> local_39;
  string local_38;
  
  poVar1 = std::operator<<(os,"[span:");
  if (v->size_ == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"[empty]",&local_39);
  }
  else {
    this = (lest *)span<unsigned_char,_18446744073709551615UL>::operator[](v,0);
    lest::to_string_abi_cxx11_(&local_38,this,chr);
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, span<T> const & v )
{
    using lest::to_string;
    return os << "[span:" << (v.empty() ? "[empty]" : to_string( v[0] ) ) << "]";
}